

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v6::internal::
       parse_align<char,fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>
                 *handler)

{
  bool bVar1;
  char *message;
  char *in_RSI;
  char *in_RDI;
  char c;
  int i;
  type align;
  undefined7 in_stack_ffffffffffffffd0;
  char in_stack_ffffffffffffffd7;
  uint local_28;
  int local_24;
  char *local_10;
  
  local_24 = 0;
  local_28 = (uint)(in_RDI + 1 != in_RSI);
  while( true ) {
    message = (char *)(ulong)((int)in_RDI[(int)local_28] - 0x3c);
    switch(message) {
    case (char *)0x0:
      local_24 = 1;
      break;
    case (char *)0x1:
      local_24 = 4;
      break;
    case (char *)0x2:
      local_24 = 2;
      break;
    case (char *)0x22:
      local_24 = 3;
    }
    if (local_24 != 0) break;
    bVar1 = (int)local_28 < 1;
    local_28 = local_28 - 1;
    if (bVar1) {
      return in_RDI;
    }
  }
  if ((int)local_28 < 1) {
    local_10 = in_RDI + 1;
  }
  else {
    in_stack_ffffffffffffffd7 = *in_RDI;
    if (in_stack_ffffffffffffffd7 == '{') {
      specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
      ::on_error((specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                  *)CONCAT17(0x7b,in_stack_ffffffffffffffd0),message);
      return in_RDI;
    }
    local_10 = in_RDI + 2;
    specs_setter<char>::on_fill
              ((specs_setter<char> *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
               '\0');
  }
  specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>
  ::on_align((specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>
              *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
             (align_t)((ulong)message >> 0x20));
  return local_10;
}

Assistant:

FMT_CONSTEXPR const Char* parse_align(const Char* begin, const Char* end,
                                      Handler&& handler) {
  FMT_ASSERT(begin != end, "");
  auto align = align::none;
  int i = 0;
  if (begin + 1 != end) ++i;
  do {
    switch (static_cast<char>(begin[i])) {
    case '<':
      align = align::left;
      break;
    case '>':
      align = align::right;
      break;
#if FMT_NUMERIC_ALIGN
    case '=':
      align = align::numeric;
      break;
#endif
    case '^':
      align = align::center;
      break;
    }
    if (align != align::none) {
      if (i > 0) {
        auto c = *begin;
        if (c == '{')
          return handler.on_error("invalid fill character '{'"), begin;
        begin += 2;
        handler.on_fill(c);
      } else
        ++begin;
      handler.on_align(align);
      break;
    }
  } while (i-- > 0);
  return begin;
}